

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbuilder_pbx.cpp
# Opt level: O0

void __thiscall ProjectBuilderSubDirs::~ProjectBuilderSubDirs(ProjectBuilderSubDirs *this)

{
  QMakeEvaluator *pQVar1;
  QMakeProject *in_RDI;
  
  if ((((ulong)(in_RDI->super_QMakeEvaluator).m_locationStack.super_QList<QMakeEvaluator::Location>.
               d.d & 1) != 0) &&
     (pQVar1 = (in_RDI->super_QMakeEvaluator).m_caller, pQVar1 != (QMakeEvaluator *)0x0)) {
    QMakeProject::~QMakeProject(in_RDI);
    operator_delete(pQVar1,0x2e0);
  }
  QString::~QString((QString *)0x15b686);
  return;
}

Assistant:

~ProjectBuilderSubDirs() {
        if(autoDelete)
            delete project;
    }